

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

size_t __thiscall ON_FixedSizePool::ElementIndex(ON_FixedSizePool *this,void *element_pointer)

{
  size_t offset;
  size_t ptr_index;
  char *ptr;
  size_t block_count;
  char *next_block;
  char *block_end;
  char *block;
  void *element_pointer_local;
  ON_FixedSizePool *this_local;
  
  if (element_pointer != (void *)0x0) {
    offset = 0;
    block_end = (char *)this->m_first_block;
    while (block_end != (char *)0x0) {
      if (block_end == (char *)this->m_al_block) {
        block_count = 0;
        next_block = (char *)this->m_al_element_array;
      }
      else {
        block_count = *(size_t *)block_end;
        next_block = *(char **)(block_end + 8);
      }
      block_end = block_end + 0x10;
      if ((block_end <= element_pointer) && (element_pointer < next_block)) {
        if ((ulong)((long)element_pointer - (long)block_end) % this->m_sizeof_element != 0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                     ,0x356,"","element_pointer is offset into an fsp element.");
          return 0xffffffffffffffff;
        }
        return ((ulong)((long)element_pointer - (long)block_end) / this->m_sizeof_element &
               0xffffffff) + offset;
      }
      offset = (ulong)((long)next_block - (long)block_end) / this->m_sizeof_element + offset;
      block_end = (char *)block_count;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,0x35d,"","element_pointer is not in allocated fsp memory.");
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t ON_FixedSizePool::ElementIndex(const void* element_pointer) const
{
  if (nullptr != element_pointer)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    size_t block_count;
    const char* ptr = (const char*)element_pointer;
    size_t ptr_index = 0;
    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        // After a ReturnAll(), a multi-block fsp has unused blocks after m_al_block.
        // Searching must terminate at m_al_block.
        next_block = nullptr;
        block_end = (const char*)m_al_element_array;
        block += (2 * sizeof(void*));
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      if (ptr >= block && ptr < block_end)
      {
        size_t offset = ptr - block;
        if (0 == offset % m_sizeof_element)
        {
          ptr_index += (unsigned int)(offset/m_sizeof_element);
          return ptr_index;
        }
        // Caller is confused
        ON_ERROR("element_pointer is offset into an fsp element.");
        return ON_MAX_SIZE_T;
      }
      block_count = (block_end - block) / m_sizeof_element;
      ptr_index += block_count;
    }
    // Caller is confused
    ON_ERROR("element_pointer is not in allocated fsp memory.");
    return ON_MAX_SIZE_T;
  }

  return ON_MAX_SIZE_T;
}